

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testloop.cpp
# Opt level: O0

void redraw(Am_Drawonable *d)

{
  Am_Drawonable *d_local;
  
  if (d == d1) {
    (**(code **)(*(long *)d1 + 0x170))
              (d1,&black,redraw::string1,redraw::string1_len,&font1,5,0x57,0,&Am_No_Style,0);
  }
  else if (d == d2) {
    (**(code **)(*(long *)d2 + 0x170))
              (d2,&black,redraw::string2,redraw::string2_len,&font2,5,7,0,&Am_No_Style,0);
  }
  else {
    (**(code **)(*(long *)d3 + 0x170))
              (d3,&black,redraw::string3,redraw::string3_len,&font3,5,7,0,&Am_No_Style,0);
  }
  (**(code **)(*(long *)d1 + 0xa0))();
  return;
}

Assistant:

void
redraw(Am_Drawonable *d)
{
  static const char *string1 = "Top-level window";
  static int string1_len = 16;
  static const char *string2 = "Child of top-level";
  static int string2_len = 18;
  static const char *string3 = "Child of child window";
  static int string3_len = 21;

  if (d == d1)
    d1->Draw_Text(black, string1, string1_len, font1, 5, 87);
  else if (d == d2)
    d2->Draw_Text(black, string2, string2_len, font2, 5, 7);
  else
    d3->Draw_Text(black, string3, string3_len, font3, 5, 7);
  d1->Flush_Output();
}